

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O1

StatusOr<google::protobuf::FeatureSet> *
google::protobuf::internal::GetEditionFeatureSetDefaults
          (StatusOr<google::protobuf::FeatureSet> *__return_storage_ptr__,Edition edition,
          FeatureSetDefaults *defaults)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  bool bVar3;
  Rep *pRVar4;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *pRVar5;
  ulong uVar6;
  undefined1 *puVar7;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *pRVar8;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this;
  string_view message;
  FeatureSetEditionDefault search;
  FeatureSet features;
  Status local_120;
  StringifySink local_118;
  string local_f8;
  FeatureSetDefaults_FeatureSetEditionDefault local_d8;
  FeatureSet local_a8;
  AlphaNum local_58;
  
  FeatureSetDefaults_FeatureSetEditionDefault::FeatureSetDefaults_FeatureSetEditionDefault
            (&local_d8,(Arena *)0x0);
  bVar3 = ValidateEnum(edition,(uint32_t *)Edition_internal_data_);
  if (!bVar3) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::Edition_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                  ,0x5164,
                  "void google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault::_internal_set_edition(::google::protobuf::Edition)"
                 );
  }
  local_d8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_d8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 4;
  this = &(defaults->field_0)._impl_.defaults_;
  pRVar8 = this;
  local_d8.field_0._impl_.edition_ = edition;
  if ((undefined1  [40])((undefined1  [40])defaults->field_0 & (undefined1  [40])0x1) !=
      (undefined1  [40])0x0) {
    pRVar4 = RepeatedPtrFieldBase::rep(&this->super_RepeatedPtrFieldBase);
    pRVar8 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
             pRVar4->elements;
  }
  pRVar5 = this;
  if (((ulong)(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar4 = RepeatedPtrFieldBase::rep(&this->super_RepeatedPtrFieldBase);
    pRVar5 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
             pRVar4->elements;
  }
  uVar6 = (long)pRVar5 + ((long)*(int *)((long)&defaults->field_0 + 0x10) * 8 - (long)pRVar8) >> 3;
  while (uVar2 = uVar6, 0 < (long)uVar2) {
    uVar6 = uVar2 >> 1;
    if (*(int *)((long)(&(pRVar8->super_RepeatedPtrFieldBase).tagged_rep_or_elem_)[uVar6] + 0x28) <=
        local_d8.field_0._impl_.edition_) {
      pRVar8 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
               (&(pRVar8->super_RepeatedPtrFieldBase).current_size_ + uVar6 * 2);
      uVar6 = ~uVar6 + uVar2;
    }
  }
  if (((ulong)(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar4 = RepeatedPtrFieldBase::rep(&this->super_RepeatedPtrFieldBase);
    this = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
           pRVar4->elements;
  }
  if (pRVar8 == this) {
    local_a8.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)0x23;
    local_a8.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0x4503c9;
    paVar1 = &local_118.buffer_.field_2;
    local_118.buffer_.field_2._8_8_ = 0;
    local_118.buffer_._M_string_length = 0;
    local_118.buffer_.field_2._M_allocated_capacity = 0;
    local_118.buffer_._M_dataplus._M_p = (pointer)paVar1;
    AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_118,edition);
    local_58.piece_._M_len = local_118.buffer_._M_string_length;
    local_58.piece_._M_str = local_118.buffer_._M_dataplus._M_p;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_f8,(lts_20250127 *)&local_a8,&local_58,
               (AlphaNum *)local_118.buffer_._M_string_length);
    message._M_str = (char *)local_f8._M_string_length;
    message._M_len = (size_t)&local_120;
    absl::lts_20250127::FailedPreconditionError(message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.buffer_._M_dataplus._M_p != paVar1) {
      operator_delete(local_118.buffer_._M_dataplus._M_p,
                      local_118.buffer_.field_2._M_allocated_capacity + 1);
    }
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::
    StatusOrData<absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSet>,&local_120)
    ;
    if ((local_120.rep_ & 1) == 0) {
      absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_120.rep_);
    }
  }
  else {
    puVar7 = *(undefined1 **)(*(long *)((long)(pRVar8 + -1) + 0x10) + 0x20);
    if ((FeatureSet *)puVar7 == (FeatureSet *)0x0) {
      puVar7 = _FeatureSet_default_instance_;
    }
    FeatureSet::FeatureSet(&local_a8,(Arena *)0x0,(FeatureSet *)puVar7);
    puVar7 = *(undefined1 **)(*(long *)((long)(pRVar8 + -1) + 0x10) + 0x18);
    if ((MessageLite *)puVar7 == (MessageLite *)0x0) {
      puVar7 = _FeatureSet_default_instance_;
    }
    FeatureSet::MergeImpl((MessageLite *)&local_a8,(MessageLite *)puVar7);
    FeatureSet::FeatureSet
              (&(__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSet>).field_1.
                data_,(Arena *)0x0,&local_a8);
    (__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSet>).field_0 =
         (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1)0x1;
    FeatureSet::~FeatureSet(&local_a8);
  }
  FeatureSetDefaults_FeatureSetEditionDefault::~FeatureSetDefaults_FeatureSetEditionDefault
            (&local_d8);
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureSet> GetEditionFeatureSetDefaults(
    Edition edition, const FeatureSetDefaults& defaults) {
  // Select the matching edition defaults.
  auto comparator = [](const auto& a, const auto& b) {
    return a.edition() < b.edition();
  };
  FeatureSetDefaults::FeatureSetEditionDefault search;
  search.set_edition(edition);
  auto first_nonmatch =
      absl::c_upper_bound(defaults.defaults(), search, comparator);
  if (first_nonmatch == defaults.defaults().begin()) {
    return Error("No valid default found for edition ", edition);
  }
  FeatureSet features = std::prev(first_nonmatch)->fixed_features();
  features.MergeFrom(std::prev(first_nonmatch)->overridable_features());
  return features;
}